

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O1

void psset_maybe_insert_purge_list(psset_t *psset,hpdata_t *ps)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  size_t sVar3;
  
  if (ps->h_purge_allowed == true) {
    sVar3 = psset_purge_list_ind(ps);
    phVar1 = psset->to_purge[sVar3].head.qlh_first;
    if (phVar1 == (hpdata_t *)0x0) {
      psset->purge_bitmap[sVar3 >> 6] = psset->purge_bitmap[sVar3 >> 6] | 1L << ((byte)sVar3 & 0x3f)
      ;
    }
    (ps->ql_link_purge).qre_next = ps;
    (ps->ql_link_purge).qre_prev = ps;
    if (phVar1 != (hpdata_t *)0x0) {
      (ps->ql_link_purge).qre_next = (phVar1->ql_link_purge).qre_prev;
      (phVar1->ql_link_purge).qre_prev = ps;
      phVar2 = (((ps->ql_link_purge).qre_prev)->ql_link_purge).qre_next;
      (ps->ql_link_purge).qre_prev = phVar2;
      (((phVar1->ql_link_purge).qre_prev)->ql_link_purge).qre_next = phVar1;
      (phVar2->ql_link_purge).qre_next = ps;
    }
    psset->to_purge[sVar3].head.qlh_first = (ps->ql_link_purge).qre_next;
  }
  return;
}

Assistant:

static void
psset_maybe_insert_purge_list(psset_t *psset, hpdata_t *ps) {
	if (hpdata_purge_allowed_get(ps)) {
		size_t ind = psset_purge_list_ind(ps);
		hpdata_purge_list_t *purge_list = &psset->to_purge[ind];
		if (hpdata_purge_list_empty(purge_list)) {
			fb_set(psset->purge_bitmap, PSSET_NPURGE_LISTS, ind);
		}
		hpdata_purge_list_append(purge_list, ps);
	}

}